

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_log(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  sexp psVar1;
  double dVar2;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_30 = (sexp)0x43e;
  if (((ulong)z & 3) != 0) {
    if (((ulong)z & 1) != 0) {
      dVar2 = (double)((long)z >> 1);
      goto LAB_00128fbf;
    }
switchD_00128fae_default:
    psVar1 = sexp_type_exception(ctx,self,3,z);
    return psVar1;
  }
  switch(z->tag) {
  case 0xb:
    dVar2 = (z->value).flonum;
    break;
  case 0xc:
    dVar2 = sexp_bignum_to_double(z);
    break;
  case 0xd:
    dVar2 = sexp_ratio_to_double(ctx,z);
    break;
  case 0xe:
    psVar1 = sexp_complex_log(ctx,z);
    return psVar1;
  default:
    goto switchD_00128fae_default;
  }
LAB_00128fbf:
  if (0.0 <= dVar2) {
    dVar2 = log(dVar2);
    psVar1 = sexp_make_flonum(ctx,dVar2);
    return psVar1;
  }
  local_28.var = &local_30;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_30 = sexp_make_flonum(ctx,dVar2);
  local_30 = sexp_make_complex(ctx,local_30,(sexp)&DAT_00000001);
  psVar1 = sexp_complex_log(ctx,local_30);
  (ctx->value).context.saves = local_28.next;
  return psVar1;
}

Assistant:

sexp sexp_log (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  double d;
#if SEXP_USE_COMPLEX
  sexp_gc_var1(tmp);
  if (sexp_complexp(z))
    return sexp_complex_log(ctx, z);
#endif
  if (sexp_flonump(z))
    d = sexp_flonum_value(z);
  else if (sexp_fixnump(z))
    d = (double)sexp_unbox_fixnum(z);
  maybe_convert_ratio(ctx, z)
  maybe_convert_bignum(z)
  else
    return sexp_type_exception(ctx, self, SEXP_NUMBER, z);
#if SEXP_USE_COMPLEX
  if (d < 0) {
    sexp_gc_preserve1(ctx, tmp);
    tmp = sexp_make_flonum(ctx, d);
    tmp = sexp_make_complex(ctx, tmp, SEXP_ZERO);
    tmp = sexp_complex_log(ctx, tmp);
    sexp_gc_release1(ctx);
    return tmp;
  }
#endif
  return sexp_make_flonum(ctx, log(d));
}